

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

unsigned_fast_type
math::wide_integer::lsb<128u,unsigned_short,void,false>
          (uintwide_t<128U,_unsigned_short,_void,_false> *x)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_fast_type uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  uVar4 = 0;
  lVar5 = 0;
  lVar6 = 0;
  while( true ) {
    uVar1 = *(ushort *)((long)(x->values).super_array<unsigned_short,_8UL>.elems + lVar5);
    if (uVar1 != 0) {
      if ((uVar1 & 1) == 0) {
        lVar7 = 0;
        uVar3 = (ulong)uVar1;
        do {
          lVar7 = lVar7 + 1;
          uVar2 = uVar3 & 2;
          uVar3 = uVar3 >> 1;
        } while (uVar2 == 0);
      }
      else {
        lVar7 = 0;
      }
      uVar4 = lVar6 * 0x10 + lVar7;
    }
    if (uVar1 != 0) break;
    lVar5 = lVar5 + 2;
    lVar6 = lVar6 + 1;
    if (lVar5 == 0x10) {
      return uVar4;
    }
  }
  return uVar4;
}

Assistant:

constexpr auto lsb(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> unsigned_fast_type
  {
    // Calculate the position of the least-significant bit.
    // Use a linear search starting from the least significant limb.

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_value_type        = typename local_wide_integer_type::representation_type::value_type;

    auto bpos   = static_cast<unsigned_fast_type>(UINT8_C(0));
    auto offset = static_cast<unsigned_fast_type>(UINT8_C(0));

    for(auto it = x.crepresentation().cbegin(); it != x.crepresentation().cend(); ++it, ++offset) // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)
    {
      const auto vi = static_cast<local_value_type>(*it & (std::numeric_limits<local_value_type>::max)());

      if(vi != static_cast<local_value_type>(UINT8_C(0)))
      {
        bpos =
          static_cast<unsigned_fast_type>
          (
              detail::lsb_helper(*it)
            + static_cast<unsigned_fast_type>
              (
                static_cast<unsigned_fast_type>(std::numeric_limits<local_value_type>::digits) * offset
              )
          );

        break;
      }
    }

    return bpos;
  }